

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O0

void iterator_inmem_snapshot_seek_test(bool flush_wal)

{
  int iVar1;
  size_t metalen;
  void *meta;
  undefined7 in_stack_fffffffffffffad8;
  fdb_iterator_seek_opt_t in_stack_fffffffffffffadf;
  fdb_file_handle *in_stack_fffffffffffffae0;
  fdb_iterator *in_stack_fffffffffffffae8;
  fdb_iterator *in_stack_fffffffffffffaf0;
  size_t bodylen;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_iterator *local_b0;
  fdb_iterator *iterator;
  size_t *psStack_a0;
  fdb_status status;
  fdb_doc *rdoc;
  fdb_doc **doc;
  fdb_kvs_handle *snap_db;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int local_70;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  bool flush_wal_local;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  bodylen = 0x10ff0d;
  memleak_start();
  dbfile._4_4_ = 5;
  rdoc = (fdb_doc *)&stack0xfffffffffffffad8;
  psStack_a0 = (size_t *)0x0;
  local_70 = system("rm -rf  iterator_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.buffercache_size = 0x400;
  fconfig.purging_interval = 1;
  fconfig.flags._3_1_ = 0;
  iterator._4_4_ =
       fdb_open((fdb_file_handle **)bodybuf._184_8_,(char *)bodybuf._176_8_,
                (fdb_config *)bodybuf._168_8_);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x619);
    iterator_inmem_snapshot_seek_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x619,"void iterator_inmem_snapshot_seek_test(bool)");
    }
  }
  iterator._4_4_ =
       fdb_kvs_open_default
                 (in_stack_fffffffffffffae0,
                  (fdb_kvs_handle **)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8),
                  (fdb_kvs_config *)0x110021);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x61b);
    iterator_inmem_snapshot_seek_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x61b,"void iterator_inmem_snapshot_seek_test(bool)");
    }
  }
  for (n = 0; n < dbfile._4_4_; n = n + 1) {
    sprintf(metabuf + 0xf8,"%c2",(ulong)((int)(char)n + 0x61));
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d",(ulong)(uint)n);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    meta = (void *)0x110160;
    metalen = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,
                   CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8),meta,metalen,
                   (void *)0x110197,bodylen);
    fdb_set(snap_db,(fdb_doc *)(&rdoc->keylen)[n]);
  }
  if (flush_wal) {
    fdb_commit((fdb_file_handle *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8),'\0'
              );
  }
  else {
    fdb_commit((fdb_file_handle *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8),'\0'
              );
  }
  iterator._4_4_ =
       fdb_snapshot_open((fdb_kvs_handle *)metabuf._64_8_,(fdb_kvs_handle **)metabuf._56_8_,
                         metabuf._48_8_);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x62f);
    iterator_inmem_snapshot_seek_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x62f,"void iterator_inmem_snapshot_seek_test(bool)");
    }
  }
  iterator._4_4_ = fdb_set_log_callback(snap_db,logCallbackFunc,"iterator_inmem_snapshot_seek_test")
  ;
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x633);
    iterator_inmem_snapshot_seek_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x633,"void iterator_inmem_snapshot_seek_test(bool)");
    }
  }
  fdb_iterator_init((fdb_kvs_handle *)doc,&local_b0,"b2",2,"d2",2,0xe);
  iterator._4_4_ =
       fdb_iterator_seek(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                         (size_t)in_stack_fffffffffffffae0,in_stack_fffffffffffffadf);
  if (iterator._4_4_ != FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x63e);
    iterator_inmem_snapshot_seek_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_ITERATOR_FAIL) {
      __assert_fail("status == FDB_RESULT_ITERATOR_FAIL",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x63e,"void iterator_inmem_snapshot_seek_test(bool)");
    }
  }
  iterator._4_4_ =
       fdb_iterator_seek(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                         (size_t)in_stack_fffffffffffffae0,in_stack_fffffffffffffadf);
  if (iterator._4_4_ != FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x643);
    iterator_inmem_snapshot_seek_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_ITERATOR_FAIL) {
      __assert_fail("status == FDB_RESULT_ITERATOR_FAIL",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x643,"void iterator_inmem_snapshot_seek_test(bool)");
    }
  }
  fdb_iterator_close(in_stack_fffffffffffffae8);
  fdb_iterator_init((fdb_kvs_handle *)doc,&local_b0,"b3",2,"d1",2,0xe);
  iterator._4_4_ =
       fdb_iterator_seek(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                         (size_t)in_stack_fffffffffffffae0,in_stack_fffffffffffffadf);
  if (iterator._4_4_ != FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x650);
    iterator_inmem_snapshot_seek_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_ITERATOR_FAIL) {
      __assert_fail("status == FDB_RESULT_ITERATOR_FAIL",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x650,"void iterator_inmem_snapshot_seek_test(bool)");
    }
  }
  iterator._4_4_ =
       fdb_iterator_seek(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                         (size_t)in_stack_fffffffffffffae0,in_stack_fffffffffffffadf);
  if (iterator._4_4_ != FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x655);
    iterator_inmem_snapshot_seek_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_ITERATOR_FAIL) {
      __assert_fail("status == FDB_RESULT_ITERATOR_FAIL",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x655,"void iterator_inmem_snapshot_seek_test(bool)");
    }
  }
  fdb_iterator_close(in_stack_fffffffffffffae8);
  fdb_iterator_init((fdb_kvs_handle *)doc,&local_b0,"b0",2,"e2",2,0xe);
  iterator._4_4_ =
       fdb_iterator_seek_to_max
                 ((fdb_iterator *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8));
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x662);
    iterator_inmem_snapshot_seek_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x662,"void iterator_inmem_snapshot_seek_test(bool)");
    }
  }
  iterator._4_4_ =
       fdb_iterator_get((fdb_iterator *)fconfig._0_8_,(fdb_doc **)kvs_config.custom_cmp_param);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x664);
    iterator_inmem_snapshot_seek_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x664,"void iterator_inmem_snapshot_seek_test(bool)");
    }
  }
  iVar1 = memcmp((void *)psStack_a0[4],"d2",*psStack_a0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n","d2",psStack_a0[4],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x665);
    iterator_inmem_snapshot_seek_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x665,"void iterator_inmem_snapshot_seek_test(bool)");
  }
  fdb_doc_free((fdb_doc *)0x11073a);
  psStack_a0 = (size_t *)0x0;
  iterator._4_4_ =
       fdb_iterator_seek(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                         (size_t)in_stack_fffffffffffffae0,in_stack_fffffffffffffadf);
  if (iterator._4_4_ != FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x66c);
    iterator_inmem_snapshot_seek_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_ITERATOR_FAIL) {
      __assert_fail("status == FDB_RESULT_ITERATOR_FAIL",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x66c,"void iterator_inmem_snapshot_seek_test(bool)");
    }
  }
  iterator._4_4_ =
       fdb_iterator_seek_to_min
                 ((fdb_iterator *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8));
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x671);
    iterator_inmem_snapshot_seek_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x671,"void iterator_inmem_snapshot_seek_test(bool)");
    }
  }
  iterator._4_4_ =
       fdb_iterator_get((fdb_iterator *)fconfig._0_8_,(fdb_doc **)kvs_config.custom_cmp_param);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x673);
    iterator_inmem_snapshot_seek_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x673,"void iterator_inmem_snapshot_seek_test(bool)");
    }
  }
  iVar1 = memcmp((void *)psStack_a0[4],"c2",*psStack_a0);
  if (iVar1 == 0) {
    fdb_doc_free((fdb_doc *)0x11094b);
    iterator._4_4_ =
         fdb_iterator_seek(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                           (size_t)in_stack_fffffffffffffae0,in_stack_fffffffffffffadf);
    if (iterator._4_4_ != FDB_RESULT_ITERATOR_FAIL) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x67a);
      iterator_inmem_snapshot_seek_test::__test_pass = 0;
      if (iterator._4_4_ != FDB_RESULT_ITERATOR_FAIL) {
        __assert_fail("status == FDB_RESULT_ITERATOR_FAIL",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0x67a,"void iterator_inmem_snapshot_seek_test(bool)");
      }
    }
    iterator._4_4_ =
         fdb_iterator_seek(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                           (size_t)in_stack_fffffffffffffae0,in_stack_fffffffffffffadf);
    if (iterator._4_4_ != FDB_RESULT_ITERATOR_FAIL) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x67f);
      iterator_inmem_snapshot_seek_test::__test_pass = 0;
      if (iterator._4_4_ != FDB_RESULT_ITERATOR_FAIL) {
        __assert_fail("status == FDB_RESULT_ITERATOR_FAIL",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0x67f,"void iterator_inmem_snapshot_seek_test(bool)");
      }
    }
    fdb_iterator_close(in_stack_fffffffffffffae8);
    fdb_kvs_close((fdb_kvs_handle *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8));
    fdb_kvs_close((fdb_kvs_handle *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8));
    fdb_close((fdb_file_handle *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8));
    for (n = 0; n < dbfile._4_4_; n = n + 1) {
      fdb_doc_free((fdb_doc *)0x110aa4);
    }
    fdb_shutdown();
    memleak_end();
    if (iterator_inmem_snapshot_seek_test::__test_pass == 0) {
      fprintf(_stderr,"%s FAILED\n","in-memory snapshot seek test");
    }
    else {
      fprintf(_stderr,"%s PASSED\n","in-memory snapshot seek test");
    }
    return;
  }
  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n","c2",psStack_a0[4],
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
          ,0x674);
  iterator_inmem_snapshot_seek_test::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0x674,"void iterator_inmem_snapshot_seek_test(bool)");
}

Assistant:

void iterator_inmem_snapshot_seek_test(bool flush_wal)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 5;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_handle *snap_db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *iterator;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    status = fdb_open(&dbfile, "./iterator_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // ------- Setup test ----------------------------------
    for (i=0; i<n; i++){
        sprintf(keybuf, "%c2",(char)i + 'a');
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    if (flush_wal) {
        fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    } else {
        fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    }
    // ---------- Snapshot tests begin -----------------------
    // WAL items are not flushed...
    status = fdb_snapshot_open(db, &snap_db, FDB_SNAPSHOT_INMEM);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "iterator_inmem_snapshot_seek_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // create an iterator on the snapshot for full range
    fdb_iterator_init(snap_db, &iterator, (void*)"b2", 2, (void*)"d2", 2,
                      FDB_ITR_NO_DELETES|
                      FDB_ITR_SKIP_MAX_KEY|
                      FDB_ITR_SKIP_MIN_KEY);

    // seek to non-existent key that happens to land on the start key which
    // should not be returned since we have passed ITR_SKIP_MIN_KEY
    status = fdb_iterator_seek(iterator, "c1", 2, FDB_ITR_SEEK_LOWER);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    // seek to non-existent key that happens to land on the end key which
    // should not be returned since we have passed ITR_SKIP_MAX_KEY
    status = fdb_iterator_seek(iterator, "c3", 2, FDB_ITR_SEEK_HIGHER);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    fdb_iterator_close(iterator);

    // create an iterator on the snapshot for full range
    fdb_iterator_init(snap_db, &iterator, (void*)"b3", 2, (void*)"d1", 2,
                      FDB_ITR_NO_DELETES|
                      FDB_ITR_SKIP_MAX_KEY|
                      FDB_ITR_SKIP_MIN_KEY);

    // seek to non-existent key that happens to land on key that is
    // smaller than the start key which should not be returned.
    status = fdb_iterator_seek(iterator, "c1", 2, FDB_ITR_SEEK_LOWER);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    // seek to non-existent key that happens to be land on key larger than
    // end key which should not be returned.
    status = fdb_iterator_seek(iterator, "c3", 2, FDB_ITR_SEEK_HIGHER);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    fdb_iterator_close(iterator);

    // create an iterator on the snapshot for just 3 items within range
    fdb_iterator_init(snap_db, &iterator, (void*)"b0", 2, (void*)"e2", 2,
                      FDB_ITR_NO_DELETES|
                      FDB_ITR_SKIP_MAX_KEY|
                      FDB_ITR_SKIP_MIN_KEY);

    // seek to max key but skip max key
    // should return a key for fdb_iterator_seek_to_max
    status = fdb_iterator_seek_to_max(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CMP(rdoc->key, "d2", rdoc->keylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // But same attempt with regular seek to max key
    // no key should be returned since we want to skip max key
    status = fdb_iterator_seek(iterator, "e2", 2, FDB_ITR_SEEK_HIGHER);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    // seek to min key but skip min key
    // should return a key for fdb_iterator_seek_to_min
    status = fdb_iterator_seek_to_min(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CMP(rdoc->key, "c2", rdoc->keylen);
    fdb_doc_free(rdoc);

    // But same attempt with regular seek to min key
    // no key should be returned since we want to skip min key
    status = fdb_iterator_seek(iterator, "b0", 2, FDB_ITR_SEEK_LOWER);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    // seek to key outside the range that happens to land on non-existent key
    // no key should be returned
    status = fdb_iterator_seek(iterator, "b0", 2, FDB_ITR_SEEK_LOWER);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    fdb_iterator_close(iterator);

    // close db handle
    fdb_kvs_close(db);
    // close snapshot handle
    fdb_kvs_close(snap_db);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("in-memory snapshot seek test");
}